

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_shift_l(mbedtls_mpi *X,size_t count)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = mbedtls_mpi_core_bitlen(X->p,(ulong)X->n);
  uVar3 = sVar2 + count;
  if (((ulong)X->n << 6 < uVar3) &&
     (iVar1 = mbedtls_mpi_grow(X,((uVar3 >> 6) + 1) - (ulong)((uVar3 & 0x3f) == 0)), iVar1 != 0)) {
    return iVar1;
  }
  mbedtls_mpi_core_shift_l(X->p,(ulong)X->n,count);
  return 0;
}

Assistant:

int mbedtls_mpi_shift_l(mbedtls_mpi *X, size_t count)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    MPI_VALIDATE_RET(X != NULL);

    i = mbedtls_mpi_bitlen(X) + count;

    if (X->n * biL < i) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, BITS_TO_LIMBS(i)));
    }

    ret = 0;

    mbedtls_mpi_core_shift_l(X->p, X->n, count);
cleanup:

    return ret;
}